

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<int,_QTextObjectHandler>::emplace_helper<QTextObjectHandler>
          (QHash<int,_QTextObjectHandler> *this,int *key,QTextObjectHandler *args)

{
  Data *pDVar1;
  piter pVar2;
  Node<int,_QTextObjectHandler> *this_00;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<int,_QTextObjectHandler>_>::findOrInsert<int>
            ((InsertionResult *)local_38,this->d,key);
  this_00 = (Node<int,_QTextObjectHandler> *)
            ((*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries +
            (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
            [(uint)local_38._8_8_ & 0x7f]);
  if (local_38[0x10] == false) {
    this_00->key = *key;
    pDVar1 = (args->component).wp.d;
    (this_00->value).iface = args->iface;
    (this_00->value).component.wp.d = pDVar1;
    (this_00->value).component.wp.value = (args->component).wp.value;
    (args->component).wp.d = (Data *)0x0;
    (args->component).wp.value = (QObject *)0x0;
  }
  else {
    QHashPrivate::Node<int,_QTextObjectHandler>::emplaceValue<QTextObjectHandler>(this_00,args);
  }
  pVar2.bucket = local_38._8_8_;
  pVar2.d = (Data<QHashPrivate::Node<int,_QTextObjectHandler>_> *)local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar2;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }